

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O2

void splice_vector<std::vector<unsigned_int,std::allocator<unsigned_int>>>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *vector,uint32_t splice_start,
               uint32_t deletion_size,const_iterator inserted_begin,const_iterator inserted_end)

{
  pointer puVar1;
  ulong uVar2;
  long lVar3;
  pointer __dest;
  ulong uVar4;
  size_t __n;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar4 = (long)(vector->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(vector->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar5 = (long)uVar4 >> 2;
  uVar7 = (long)inserted_end._M_current - (long)inserted_begin._M_current >> 2;
  uVar2 = uVar7 & 0xffffffff;
  uVar6 = (int)uVar7 + splice_start;
  lVar3 = uVar2 - deletion_size;
  if (lVar3 != 0 && deletion_size <= uVar2) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(vector,lVar5 + lVar3);
  }
  uVar2 = (ulong)(deletion_size + splice_start);
  uVar4 = uVar4 & 0x3fffffffc;
  if ((uVar6 < deletion_size + splice_start) || ((uint)lVar5 <= uVar6)) {
    __n = uVar4 + uVar2 * -4;
    if (__n == 0) goto LAB_0015d27f;
    puVar1 = (vector->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __dest = puVar1 + uVar6;
  }
  else {
    __n = uVar4 + uVar2 * -4;
    if (__n == 0) goto LAB_0015d27f;
    puVar1 = (vector->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __dest = (pointer)((long)(vector->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish - __n);
  }
  memmove(__dest,puVar1 + uVar2,__n);
LAB_0015d27f:
  if (inserted_end._M_current != inserted_begin._M_current) {
    memmove((vector->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start + splice_start,inserted_begin._M_current,
            (long)inserted_end._M_current - (long)inserted_begin._M_current);
  }
  if (-1 < lVar3) {
    return;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (vector,((long)(vector->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(vector->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data._M_start >> 2) + lVar3);
  return;
}

Assistant:

void splice_vector(
  T &vector, uint32_t splice_start, uint32_t deletion_size,
  typename T::const_iterator inserted_begin,
  typename T::const_iterator inserted_end
) {
  uint32_t original_size = vector.size();
  uint32_t insertion_size = inserted_end - inserted_begin;
  uint32_t insertion_end = splice_start + insertion_size;
  uint32_t deletion_end = splice_start + deletion_size;
  int64_t size_delta = static_cast<int64_t>(insertion_size) - deletion_size;

  if (size_delta > 0) {
    vector.resize(vector.size() + size_delta);
  }

  if (insertion_end >= deletion_end && insertion_end < original_size) {
    std::copy_backward(
      vector.cbegin() + deletion_end,
      vector.cbegin() + original_size,
      vector.end()
    );
  } else {
    std::copy(
      vector.cbegin() + deletion_end,
      vector.cbegin() + original_size,
      vector.begin() + insertion_end
    );
  }

  std::copy(
    inserted_begin,
    inserted_end,
    vector.begin() + splice_start
  );

  if (size_delta < 0) {
    vector.resize(vector.size() + size_delta);
  }
}